

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineWriter::InitParameters(InlineWriter *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  long in_RDI;
  string value;
  string key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  Params *__range2;
  allocator *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  allocator local_131;
  string local_130 [4];
  int in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  char *local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  string local_48 [32];
  reference local_28;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x28) + 0x60;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe88);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe88);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    local_28 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0xac33f1);
    std::__cxx11::string::string(local_48,(string *)local_28);
    local_50 = std::__cxx11::string::begin();
    local_58 = std::__cxx11::string::end();
    local_60 = std::__cxx11::string::begin();
    __first._M_current._4_4_ = in_stack_fffffffffffffeac;
    __first._M_current._0_4_ = in_stack_fffffffffffffea8;
    local_78 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                 (__first,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                  (_func_int_int *)in_stack_fffffffffffffe90);
    std::__cxx11::string::string(local_98,(string *)&local_28->second);
    bVar1 = std::operator==(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffeac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
    if (bVar1) {
      in_stack_fffffffffffffea8 =
           std::__cxx11::stoi(in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,0);
      *(int *)(in_RDI + 0xc0) = in_stack_fffffffffffffea8;
      if ((*(int *)(in_RDI + 0xc0) < 0) || (5 < *(int *)(in_RDI + 0xc0))) {
        in_stack_fffffffffffffea0._M_current = (char *)&local_b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,"Engine",(allocator *)in_stack_fffffffffffffea0._M_current);
        in_stack_fffffffffffffe98._M_current = (char *)&local_e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_e0,"InlineWriter",(allocator *)in_stack_fffffffffffffe98._M_current);
        in_stack_fffffffffffffe90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_108,"InitParameters",(allocator *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe88 = &local_131;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_130,
                   "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                   ,in_stack_fffffffffffffe88);
        helper::Throw<std::invalid_argument>
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
    }
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_48);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void InlineWriter::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "InlineWriter", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}